

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O1

int WebRtcIsac_EncodeSpec
              (int16_t *fr,int16_t *fi,int16_t AvgPitchGain_Q12,ISACBand band,Bitstr *streamdata)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  char cVar4;
  int k;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  int16_t (*paiVar8) [60];
  ulong uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint32_t seed;
  short sVar15;
  short sVar16;
  int32_t *piVar17;
  short sVar18;
  short sVar19;
  int16_t *a;
  int32_t *R;
  bool bVar20;
  int16_t ARCoefQ12 [7];
  int32_t gain2_Q10;
  int32_t CorrQ7 [7];
  int32_t CorrQ7_norm [7];
  int16_t RCQ15 [6];
  uint16_t invARSpecQ8 [120];
  int16_t ditherQ7 [480];
  int16_t dataQ7 [480];
  int32_t PSpec [120];
  int32_t invARSpec2_Q16 [120];
  int local_cd4;
  ushort local_cd0;
  int16_t local_cca [7];
  int32_t local_cbc;
  uint local_cb8 [8];
  int32_t local_c98;
  int local_c94 [8];
  int16_t local_c74 [6];
  uint16_t local_c68 [120];
  int16_t local_b78;
  short local_b76;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  int16_t local_7b8;
  short asStack_7b6 [479];
  uint auStack_3f8 [242];
  
  seed = streamdata->W_upper;
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(&local_b78,seed,(int)AvgPitchGain_Q12,0);
    local_cd4 = 0x1e0;
    local_cd0 = 0;
  }
  else {
    lVar6 = 0;
    do {
      iVar11 = seed * 0xbb38435;
      seed = iVar11 + 0x3619636b;
      (&local_b78)[lVar6] = (short)(iVar11 + 0x3719636b >> 0x1b);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1e0);
    local_cd0 = (ushort)(band == kIsacUpperBand12);
    local_cd4 = 0x1e0;
    if (band == kIsacUpperBand12) {
      local_cd4 = 0xf0;
    }
  }
  if (band == kIsacLowerBand) {
    uVar9 = 0xfffffffffffffffc;
    do {
      uVar2 = *(undefined4 *)((long)&uStack_b6c + uVar9 * 2);
      sVar18 = (short)*(undefined4 *)((long)&uStack_b70 + uVar9 * 2);
      sVar18 = (*(short *)((long)fr + uVar9 + 4) + sVar18 + 0x40U & 0xff80) - sVar18;
      asStack_7b6[uVar9 + 3] = sVar18;
      sVar19 = *(short *)((long)&uStack_b70 + uVar9 * 2 + 2);
      sVar19 = (*(short *)((long)fi + uVar9 + 4) + sVar19 + 0x40U & 0xff80) - sVar19;
      asStack_7b6[uVar9 + 4] = sVar19;
      sVar16 = (short)uVar2;
      sVar16 = (*(short *)((long)fr + uVar9 + 6) + sVar16 + 0x40U & 0xff80) - sVar16;
      asStack_7b6[uVar9 + 5] = sVar16;
      sVar15 = *(short *)((long)&uStack_b6c + uVar9 * 2 + 2);
      sVar15 = (*(short *)((long)fi + uVar9 + 6) + sVar15 + 0x40U & 0xff80) - sVar15;
      asStack_7b6[uVar9 + 6] = sVar15;
      *(uint *)((long)auStack_3f8 + uVar9 + 4) =
           (uint)((int)sVar15 * (int)sVar15 + (int)sVar16 * (int)sVar16 +
                 (int)sVar19 * (int)sVar19 + (int)sVar18 * (int)sVar18) >> 2;
      uVar9 = uVar9 + 4;
    } while (uVar9 < 0x1dc);
  }
  else if (band == kIsacUpperBand12) {
    uVar9 = 0xfffffffffffffffc;
    do {
      uVar2 = *(undefined4 *)((long)&uStack_b6c + uVar9 * 2);
      sVar15 = (short)*(undefined4 *)((long)&uStack_b70 + uVar9 * 2);
      sVar15 = (*(short *)((long)fr + uVar9 + 4) + sVar15 + 0x40U & 0xff80) - sVar15;
      asStack_7b6[uVar9 + 3] = sVar15;
      sVar19 = *(short *)((long)&uStack_b70 + uVar9 * 2 + 2);
      sVar19 = (*(short *)((long)fi + uVar9 + 4) + sVar19 + 0x40U & 0xff80) - sVar19;
      asStack_7b6[uVar9 + 4] = sVar19;
      *(uint *)((long)auStack_3f8 + uVar9 * 2 + 8) =
           (uint)((int)sVar19 * (int)sVar19 + (int)sVar15 * (int)sVar15) >> 1;
      sVar15 = (short)uVar2;
      sVar15 = (*(short *)((long)fr + uVar9 + 6) + sVar15 + 0x40U & 0xff80) - sVar15;
      asStack_7b6[uVar9 + 5] = sVar15;
      sVar19 = *(short *)((long)&uStack_b6c + uVar9 * 2 + 2);
      sVar19 = (*(short *)((long)fi + uVar9 + 6) + sVar19 + 0x40U & 0xff80) - sVar19;
      asStack_7b6[uVar9 + 6] = sVar19;
      *(uint *)((long)auStack_3f8 + uVar9 * 2 + 0xc) =
           (uint)((int)sVar19 * (int)sVar19 + (int)sVar15 * (int)sVar15) >> 1;
      uVar9 = uVar9 + 4;
    } while (uVar9 < 0xec);
  }
  else if (band == kIsacUpperBand16) {
    lVar6 = 0x1de;
    lVar13 = 0;
    do {
      uVar2 = (&uStack_b74)[lVar13];
      sVar15 = (*(short *)((long)fr + lVar13) + (short)*(undefined4 *)(&local_b78 + lVar13 * 2) +
                0x40U & 0xff80) - (short)*(undefined4 *)(&local_b78 + lVar13 * 2);
      (&local_7b8)[lVar13 * 2] = sVar15;
      sVar18 = (*(short *)((long)fi + lVar13) + (&local_b76)[lVar13 * 2] + 0x40U & 0xff80) -
               (&local_b76)[lVar13 * 2];
      asStack_7b6[lVar13 * 2] = sVar18;
      sVar16 = (*(short *)((long)fr + lVar6) + (short)uVar2 + 0x40U & 0xff80) - (short)uVar2;
      *(short *)(auStack_3f8 + lVar13 + -0xef) = sVar16;
      sVar19 = *(short *)((long)&uStack_b74 + lVar13 * 4 + 2);
      sVar19 = (*(short *)((long)fi + lVar6) + sVar19 + 0x40U & 0xff80) - sVar19;
      *(short *)((long)auStack_3f8 + lVar13 * 4 + -0x3ba) = sVar19;
      *(uint *)((long)auStack_3f8 + lVar13 * 2) =
           (uint)((int)sVar19 * (int)sVar19 + (int)sVar16 * (int)sVar16 +
                 (int)sVar18 * (int)sVar18 + (int)sVar15 * (int)sVar15) >> 2;
      lVar13 = lVar13 + 2;
      lVar6 = lVar6 + -2;
    } while (lVar13 != 0xf0);
  }
  puVar7 = auStack_3f8 + 0x77;
  lVar6 = 0;
  do {
    uVar14 = *puVar7;
    auStack_3f8[lVar6 + 0x78] = (int)(auStack_3f8[lVar6] + uVar14 + 0x10) >> 5;
    *(int *)(local_c68 + lVar6 * 2) = (int)((auStack_3f8[lVar6] + 0x10) - uVar14) >> 5;
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + -1;
  } while (lVar6 != 0x3c);
  local_cb8[0] = 2;
  lVar6 = 0;
  do {
    local_cb8[0] = local_cb8[0] + auStack_3f8[lVar6 + 0x78];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x3c);
  paiVar8 = WebRtcIsac_kCos;
  uVar9 = 0;
  do {
    lVar6 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + ((int)(*paiVar8)[lVar6] * *(int *)(local_c68 + lVar6 * 2) + 0x100 >> 9);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x3c);
    local_cb8[uVar9 + 1] = uVar14;
    paiVar8 = paiVar8 + 2;
    bVar20 = uVar9 < 4;
    uVar9 = uVar9 + 2;
  } while (bVar20);
  lVar6 = 0x1a7a18;
  uVar9 = 1;
  do {
    lVar13 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + ((int)((int)*(short *)(lVar6 + lVar13 * 2) * auStack_3f8[lVar13 + 0x78] +
                              0x100) >> 9);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x3c);
    local_cb8[uVar9 + 1] = uVar14;
    lVar6 = lVar6 + 0xf0;
    bVar20 = uVar9 < 4;
    uVar9 = uVar9 + 2;
  } while (bVar20);
  if (local_cb8[0] == 0) {
    uVar10 = 0;
  }
  else {
    uVar14 = (int)local_cb8[0] >> 0x1f ^ local_cb8[0];
    sVar15 = (ushort)(uVar14 < 0x8000) * 0x10;
    sVar19 = sVar15 + 8;
    if (0x7fffff < uVar14 << (sbyte)sVar15) {
      sVar19 = sVar15;
    }
    sVar15 = sVar19 + 4;
    if (0x7ffffff < uVar14 << ((byte)sVar19 & 0x1f)) {
      sVar15 = sVar19;
    }
    sVar19 = sVar15 + 2;
    if (0x1fffffff < uVar14 << ((byte)sVar15 & 0x1f)) {
      sVar19 = sVar15;
    }
    uVar10 = sVar19 + (ushort)(uVar14 << ((byte)sVar19 & 0x1f) < 0x40000000);
  }
  cVar4 = (char)uVar10;
  if (uVar10 < 0x13) {
    lVar6 = 0;
    do {
      (&local_c98)[lVar6] = (int)local_cb8[lVar6] >> (0x12U - cVar4 & 0x1f);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  else {
    lVar6 = 0;
    do {
      (&local_c98)[lVar6] = local_cb8[lVar6] << (cVar4 - 0x12U & 0x1f);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  R = &local_c98;
  WebRtcSpl_AutoCorrToReflCoef(R,6,local_c74);
  WebRtcIsac_EncodeRc(local_c74,streamdata);
  a = local_cca;
  WebRtcSpl_ReflCoefToLpc(local_c74,6,a);
  uVar9 = 0;
  lVar6 = 1;
  uVar14 = 0;
  do {
    lVar13 = 0;
    piVar17 = R;
    do {
      uVar14 = uVar14 + (((int)local_cca[lVar13] * *piVar17 + 0x100 >> 9) * (int)local_cca[uVar9] +
                         4 >> 3);
      lVar13 = lVar13 + 1;
      piVar17 = piVar17 + -1;
    } while (lVar6 != lVar13);
    if (uVar9 < 6) {
      lVar13 = 1;
      do {
        uVar14 = uVar14 + (((int)a[lVar13] * (&local_c98)[lVar13] + 0x100 >> 9) *
                           (int)local_cca[uVar9] + 4 >> 3);
        lVar1 = uVar9 + lVar13;
        lVar13 = lVar13 + 1;
      } while (lVar1 != 6);
    }
    uVar9 = uVar9 + 1;
    lVar6 = lVar6 + 1;
    R = R + 1;
    a = a + 1;
  } while (uVar9 != 7);
  uVar5 = uVar14 << (0x12U - cVar4 & 0x1f);
  if (0x12 < uVar10) {
    uVar5 = uVar14 >> (cVar4 - 0x12U & 0x1f);
  }
  if (0x7ffffffe < uVar5) {
    uVar5 = 0x7fffffff;
  }
  local_cbc = WebRtcSpl_DivResultInQ31(0x78,uVar5);
  WebRtcIsac_EncodeGain2(&local_cbc,streamdata);
  FindInvArSpec(local_cca,local_cbc,(int32_t *)(auStack_3f8 + 0x78));
  iVar12 = (uint)(0xffff < auStack_3f8[0x78]) * 0x10;
  iVar11 = iVar12 + 8;
  if ((auStack_3f8[0x78] >> (sbyte)iVar12 & 0xff00) == 0) {
    iVar11 = iVar12;
  }
  iVar12 = iVar11 + 4;
  if ((auStack_3f8[0x78] >> ((byte)iVar11 & 0x1f) & 0xf0) == 0) {
    iVar12 = iVar11;
  }
  iVar11 = iVar12 + 2;
  if ((auStack_3f8[0x78] >> ((byte)iVar12 & 0x1f) & 0xc) == 0) {
    iVar11 = iVar12;
  }
  uVar14 = (auStack_3f8[0x78] >> ((byte)iVar11 & 0x1f) & 2) >> 1;
  uVar14 = 1 << ((byte)((ushort)((short)uVar14 + (short)iVar11 +
                                (ushort)((auStack_3f8[0x78] >> (uVar14 + iVar11 & 0x1f) & 1) != 0))
                       >> 1) & 0x1f);
  lVar6 = 0;
  do {
    uVar5 = auStack_3f8[lVar6 + 0x78];
    uVar3 = -uVar5;
    if (0 < (int)uVar5) {
      uVar3 = uVar5;
    }
    uVar5 = uVar3 / uVar14 + uVar14 >> 1;
    iVar11 = -10;
    do {
      uVar14 = uVar5;
      uVar5 = uVar3 / uVar14 + uVar14 >> 1;
      if (uVar5 == uVar14) break;
      bVar20 = iVar11 != 0;
      iVar11 = iVar11 + 1;
    } while (bVar20);
    local_c68[lVar6] = (uint16_t)uVar5;
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x78) {
      iVar11 = WebRtcIsac_EncLogisticMulti2(streamdata,&local_7b8,local_c68,local_cd4,local_cd0);
      return (int)(short)iVar11 >> 0x1f & (int)(short)iVar11;
    }
  } while( true );
}

Assistant:

int WebRtcIsac_EncodeSpec(const int16_t* fr, const int16_t* fi,
                          int16_t AvgPitchGain_Q12, enum ISACBand band,
                          Bitstr* streamdata) {
  int16_t ditherQ7[FRAMESAMPLES];
  int16_t dataQ7[FRAMESAMPLES];
  int32_t PSpec[FRAMESAMPLES_QUARTER];
  int32_t invARSpec2_Q16[FRAMESAMPLES_QUARTER];
  uint16_t invARSpecQ8[FRAMESAMPLES_QUARTER];
  int32_t CorrQ7[AR_ORDER + 1];
  int32_t CorrQ7_norm[AR_ORDER + 1];
  int16_t RCQ15[AR_ORDER];
  int16_t ARCoefQ12[AR_ORDER + 1];
  int32_t gain2_Q10;
  int16_t val;
  int32_t nrg, res;
  uint32_t sum;
  int32_t in_sqrt;
  int32_t newRes;
  int16_t err;
  uint32_t nrg_u32;
  int shift_var;
  int k, n, j, i;
  int is_12khz = !kIsSWB12;
  int num_dft_coeff = FRAMESAMPLES;

  /* Create dither signal. */
  if (band == kIsacLowerBand) {
    GenerateDitherQ7Lb(ditherQ7, streamdata->W_upper, FRAMESAMPLES,
                       AvgPitchGain_Q12);
  } else {
    GenerateDitherQ7LbUB(ditherQ7, streamdata->W_upper, FRAMESAMPLES);
    if (band == kIsacUpperBand12) {
      is_12khz = kIsSWB12;
      num_dft_coeff = FRAMESAMPLES_HALF;
    }
  }

  /* add dither and quantize, and compute power spectrum */
  switch (band) {
    case kIsacLowerBand: {
      for (k = 0; k < FRAMESAMPLES; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
    case kIsacUpperBand12: {
      for (k = 0, j = 0; k < FRAMESAMPLES_HALF; k += 4) {
        val = ((*fr++ + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;

        val = ((*fr++ + ditherQ7[k + 2] + 64) & 0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum = val * val;

        val = ((*fi++ + ditherQ7[k + 3] + 64) & 0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[j++] = sum >> 1;
      }
      break;
    }
    case kIsacUpperBand16: {
      for (j = 0, k = 0; k < FRAMESAMPLES; k += 4, j++) {
        val = ((fr[j] + ditherQ7[k]   + 64) & 0xFF80) - ditherQ7[k];
        dataQ7[k] = val;
        sum = val * val;

        val = ((fi[j] + ditherQ7[k + 1] + 64) & 0xFF80) - ditherQ7[k + 1];
        dataQ7[k + 1] = val;
        sum += val * val;

        val = ((fr[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 2] + 64) &
            0xFF80) - ditherQ7[k + 2];
        dataQ7[k + 2] = val;
        sum += val * val;

        val = ((fi[(FRAMESAMPLES_HALF) - 1 - j] + ditherQ7[k + 3] + 64) &
            0xFF80) - ditherQ7[k + 3];
        dataQ7[k + 3] = val;
        sum += val * val;

        PSpec[k >> 2] = sum >> 2;
      }
      break;
    }
  }

  /* compute correlation from power spectrum */
  FindCorrelation(PSpec, CorrQ7);

  /* Find AR coefficients */
  /* Aumber of bit shifts to 14-bit normalize CorrQ7[0]
   * (leaving room for sign) */
  shift_var = WebRtcSpl_NormW32(CorrQ7[0]) - 18;

  if (shift_var > 0) {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] << shift_var;
    }
  } else {
    for (k = 0; k < AR_ORDER + 1; k++) {
      CorrQ7_norm[k] = CorrQ7[k] >> (-shift_var);
    }
  }

  /* Find RC coefficients. */
  WebRtcSpl_AutoCorrToReflCoef(CorrQ7_norm, AR_ORDER, RCQ15);

  /* Quantize & code RC Coefficient. */
  WebRtcIsac_EncodeRc(RCQ15, streamdata);

  /* RC -> AR coefficients */
  WebRtcSpl_ReflCoefToLpc(RCQ15, AR_ORDER, ARCoefQ12);

  /* Compute ARCoef' * Corr * ARCoef in Q19. */
  nrg = 0;
  for (j = 0; j <= AR_ORDER; j++) {
    for (n = 0; n <= j; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[j - n] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
    for (n = j + 1; n <= AR_ORDER; n++) {
      nrg += (ARCoefQ12[j] * ((CorrQ7_norm[n - j] * ARCoefQ12[n] + 256) >> 9) +
          4) >> 3;
    }
  }

  nrg_u32 = (uint32_t)nrg;
  if (shift_var > 0) {
    nrg_u32 = nrg_u32 >> shift_var;
  } else {
    nrg_u32 = nrg_u32 << (-shift_var);
  }
  if (nrg_u32 > 0x7FFFFFFF) {
    nrg = 0x7FFFFFFF;
  }  else {
    nrg = (int32_t)nrg_u32;
  }
  /* Also shifts 31 bits to the left! */
  gain2_Q10 = WebRtcSpl_DivResultInQ31(FRAMESAMPLES_QUARTER, nrg);

  /* Quantize & code gain2_Q10. */
  if (WebRtcIsac_EncodeGain2(&gain2_Q10, streamdata)) {
    return -1;
  }

  /* Compute inverse AR power spectrum. */
  FindInvArSpec(ARCoefQ12, gain2_Q10, invARSpec2_Q16);
  /* Convert to magnitude spectrum, by doing square-roots
   * (modified from SPLIB). */
  res = 1 << (WebRtcSpl_GetSizeInBits(invARSpec2_Q16[0]) >> 1);
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    in_sqrt = invARSpec2_Q16[k];
    i = 10;
    /* Negative values make no sense for a real sqrt-function. */
    if (in_sqrt < 0) {
      in_sqrt = -in_sqrt;
    }
    newRes = (in_sqrt / res + res) >> 1;
    do {
      res = newRes;
      newRes = (in_sqrt / res + res) >> 1;
    } while (newRes != res && i-- > 0);

    invARSpecQ8[k] = (int16_t)newRes;
  }
  /* arithmetic coding of spectrum */
  err = WebRtcIsac_EncLogisticMulti2(streamdata, dataQ7, invARSpecQ8,
                                     num_dft_coeff, is_12khz);
  if (err < 0) {
    return (err);
  }
  return 0;
}